

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall crnlib::sparse_bit_array::resize(sparse_bit_array *this,uint size)

{
  uint uVar1;
  void *pvVar2;
  int in_ESI;
  uint *in_RDI;
  uint32 *p;
  uint i;
  uint n;
  sparse_bit_array temp;
  uint num_groups;
  uint in_stack_00000194;
  char *in_stack_00000198;
  char *in_stack_000001a0;
  sparse_bit_array *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  sparse_bit_array *this_00;
  uint local_34;
  sparse_bit_array local_20;
  uint local_10;
  
  local_10 = in_ESI + 0x1ffU >> 9;
  if (local_10 != *in_RDI) {
    if (local_10 == 0) {
      clear((sparse_bit_array *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else {
      this_00 = &local_20;
      sparse_bit_array(this_00);
      swap((sparse_bit_array *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
           in_stack_ffffffffffffff98);
      *in_RDI = local_10;
      pvVar2 = crnlib_calloc((size_t)this_00,in_stack_ffffffffffffffa8,
                             (size_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                            );
      *(void **)(in_RDI + 2) = pvVar2;
      if (*(long *)(in_RDI + 2) == 0) {
        crnlib_assert(in_stack_000001a0,in_stack_00000198,in_stack_00000194);
      }
      uVar1 = math::minimum<unsigned_int>(local_20.m_num_groups,*in_RDI);
      for (local_34 = 0; local_34 < uVar1; local_34 = local_34 + 1) {
        if (local_20.m_ppGroups[local_34] != (uint32 *)0x0) {
          *(uint32 **)(*(long *)(in_RDI + 2) + (ulong)local_34 * 8) = local_20.m_ppGroups[local_34];
          local_20.m_ppGroups[local_34] = (uint32 *)0x0;
        }
      }
      ~sparse_bit_array((sparse_bit_array *)0x196dc0);
    }
  }
  return;
}

Assistant:

void sparse_bit_array::resize(uint size) {
  uint num_groups = (size + cBitsPerGroup - 1) >> cBitsPerGroupShift;
  if (num_groups == m_num_groups)
    return;

  if (!num_groups) {
    clear();
    return;
  }

  sparse_bit_array temp;
  temp.swap(*this);

  m_num_groups = num_groups;
  m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
  CRNLIB_VERIFY(m_ppGroups);

  uint n = math::minimum(temp.m_num_groups, m_num_groups);
  for (uint i = 0; i < n; i++) {
    uint32* p = temp.m_ppGroups[i];
    if (p) {
      m_ppGroups[i] = temp.m_ppGroups[i];
      temp.m_ppGroups[i] = NULL;
    }
  }
}